

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_long> * __thiscall
cimg_library::CImg<unsigned_long>::fill(CImg<unsigned_long> *this,unsigned_long val)

{
  unsigned_long *puVar1;
  bool bVar2;
  unsigned_long *__s;
  
  bVar2 = is_empty(this);
  if (!bVar2) {
    __s = this->_data;
    if (val == 0) {
      memset(__s,0,(ulong)this->_width * (ulong)this->_height *
                   (ulong)this->_spectrum * (ulong)this->_depth * 8);
    }
    else {
      puVar1 = __s + (ulong)this->_spectrum * (ulong)this->_depth *
                     (ulong)this->_height * (ulong)this->_width;
      for (; __s < puVar1; __s = __s + 1) {
        *__s = val;
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& fill(const T val) {
      if (is_empty()) return *this;
      if (val && sizeof(T)!=1) cimg_for(*this,ptrd,T) *ptrd = val;
      else std::memset(_data,(int)val,sizeof(T)*size());
      return *this;
    }